

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

bool __thiscall
llama_context::state_save_file
          (llama_context *this,char *filepath,llama_token *tokens,size_t n_token_count)

{
  llama_file file;
  llama_io_write_file io;
  llama_file lStack_58;
  llama_io_write_i local_50;
  undefined1 *local_48;
  undefined8 local_40;
  void *pvStack_38;
  undefined8 local_30;
  long lStack_28;
  
  llama_file::llama_file(&lStack_58,filepath,"wb");
  llama_file::write_u32(&lStack_58,0x6767736e);
  llama_file::write_u32(&lStack_58,9);
  llama_file::write_u32(&lStack_58,(uint32_t)n_token_count);
  llama_file::write_raw(&lStack_58,tokens,n_token_count << 2);
  local_50._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_file_00285710;
  local_40 = 0;
  pvStack_38 = (void *)0x0;
  local_30 = 0;
  lStack_28 = 0;
  local_48 = (undefined1 *)&lStack_58;
  state_write_data(this,&local_50);
  local_50._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_file_00285710;
  if (pvStack_38 != (void *)0x0) {
    operator_delete(pvStack_38,lStack_28 - (long)pvStack_38);
  }
  llama_file::~llama_file(&lStack_58);
  return true;
}

Assistant:

bool llama_context::state_save_file(const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_SESSION_MAGIC);
    file.write_u32(LLAMA_SESSION_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_write_data(io);

    return true;
}